

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockets_kernel_2.h
# Opt level: O3

int __thiscall dlib::connection::shutdown_outgoing(connection *this)

{
  mutex *__mutex;
  int iVar1;
  
  __mutex = &this->sd_mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((this->sdo == false) && (this->sd != true)) {
    this->sdo = true;
    iVar1 = ::shutdown(this->connection_socket,1);
    this->sdr = iVar1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar1 = this->sdr;
  }
  return iVar1;
}

Assistant:

int shutdown_outgoing (
        ) 
        {
            sd_mutex.lock();
            if (sdo || sd)
            {
                sd_mutex.unlock();
                return sdr;
            }
            sdo = true;
            sdr = ::shutdown(connection_socket,SHUT_WR); 
            int temp = sdr;
            sd_mutex.unlock();
            return temp;  
        }